

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_code_options.c
# Opt level: O2

int main(void)

{
  int iVar1;
  uchar *puVar2;
  uchar *puVar3;
  test_state state;
  aec_stream strm;
  
  state.ibuf_len = 0xc00;
  state.buf_len = 0xc00;
  state.cbuf_len = 0x1800;
  puVar2 = (uchar *)malloc(0xc00);
  state.ubuf = puVar2;
  puVar3 = (uchar *)malloc(0x1800);
  state.cbuf = puVar3;
  state.obuf = (uchar *)malloc(0xc00);
  if ((puVar3 == (uchar *)0x0 || puVar2 == (uchar *)0x0) || state.obuf == (uchar *)0x0) {
    puts("Not enough memory.");
    iVar1 = 99;
  }
  else {
    state.strm = &strm;
    strm.flags = 0;
    puts("***************************");
    puts("Checking with small buffers");
    puts("***************************");
    state.codec = encode_decode_small;
    iVar1 = check_byte_orderings(&state);
    if (iVar1 == 0) {
      puts("***************************");
      puts("Checking with large buffers");
      puts("***************************");
      state.codec = encode_decode_large;
      iVar1 = check_byte_orderings(&state);
    }
    free(state.ubuf);
    free(state.cbuf);
    free(state.obuf);
  }
  return iVar1;
}

Assistant:

int main (void)
{
    int status;
    struct aec_stream strm;
    struct test_state state;

    state.buf_len = state.ibuf_len = BUF_SIZE;
    state.cbuf_len = 2 * BUF_SIZE;

    state.ubuf = (unsigned char *)malloc(state.buf_len);
    state.cbuf = (unsigned char *)malloc(state.cbuf_len);
    state.obuf = (unsigned char *)malloc(state.buf_len);

    if (!state.ubuf || !state.cbuf || !state.obuf) {
        printf("Not enough memory.\n");
        return 99;
    }

    strm.flags = 0;
    state.strm = &strm;

    printf("***************************\n");
    printf("Checking with small buffers\n");
    printf("***************************\n");
    state.codec = encode_decode_small;
    status = check_byte_orderings(&state);
    if (status)
        goto DESTRUCT;

    printf("***************************\n");
    printf("Checking with large buffers\n");
    printf("***************************\n");
    state.codec = encode_decode_large;
    status = check_byte_orderings(&state);

DESTRUCT:
    free(state.ubuf);
    free(state.cbuf);
    free(state.obuf);

    return status;
}